

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O3

void __thiscall Centaurus::Grammar<char>::~Grammar(Grammar<char> *this)

{
  pointer pwVar1;
  
  (this->super_IGrammar)._vptr_IGrammar = (_func_int **)&PTR__Grammar_001bcbb8;
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_options).
                 super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ._M_h);
  (this->m_grammar_name)._vptr_Identifier = (_func_int **)&PTR__Identifier_001bcb38;
  pwVar1 = (this->m_grammar_name).m_id._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar1 != &(this->m_grammar_name).m_id.field_2) {
    operator_delete(pwVar1);
  }
  (this->m_root_id)._vptr_Identifier = (_func_int **)&PTR__Identifier_001bcb38;
  pwVar1 = (this->m_root_id).m_id._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar1 != &(this->m_root_id).m_id.field_2) {
    operator_delete(pwVar1);
  }
  std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::~vector
            (&this->m_identifiers);
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->m_networks)._M_h);
  return;
}

Assistant:

virtual ~Grammar()
    {
    }